

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O2

lzma_ret lzma_decode(lzma_coder_conflict8 *coder,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,
                    size_t in_size)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  byte bVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  lzma_vli lVar23;
  uint uVar24;
  int iVar25;
  probability *ppVar26;
  uint8_t *__src;
  uint8_t *__dest;
  size_t sVar27;
  size_t sVar28;
  uint32_t uVar29;
  probability (*papVar30) [768];
  size_t sVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  lzma_ret local_f4;
  lzma_lzma_state local_d4;
  uint local_c4;
  ulong local_c0;
  uint local_b4;
  size_t local_b0;
  ulong local_a8;
  uint local_9c;
  
  puVar6 = dictptr->buf;
  sVar7 = dictptr->pos;
  local_b0 = dictptr->full;
  sVar31 = dictptr->limit;
  sVar8 = dictptr->size;
  uVar14 = (coder->rc).init_bytes_left;
  uVar3 = coder->pos_mask;
  local_c0 = (ulong)((uint)sVar7 & uVar3);
  uVar9 = coder->uncompressed_size;
  sVar28 = uVar9 + sVar7;
  if (sVar31 - sVar7 <= uVar9) {
    sVar28 = sVar31;
  }
  if (uVar9 == 0xffffffffffffffff) {
    sVar28 = sVar31;
  }
  local_d4 = coder->state;
  uVar21 = (ulong)coder->rep0;
  local_c4 = coder->rep1;
  local_b4 = coder->rep2;
  local_9c = coder->rep3;
  papVar30 = (probability (*) [768])coder->probs;
  uVar35 = coder->symbol;
  uVar22 = (ulong)uVar35;
  uVar29 = coder->limit;
  uVar16 = coder->offset;
  uVar24 = coder->len;
  local_a8 = (ulong)uVar24;
  uVar4 = coder->literal_pos_mask;
  uVar5 = coder->literal_context_bits;
  while (uVar14 = uVar14 - 1, uVar14 != 0xffffffff) {
    sVar31 = *in_pos;
    if (sVar31 == in_size) {
      return LZMA_OK;
    }
    (coder->rc).code = (uint)in[sVar31] | (coder->rc).code << 8;
    *in_pos = sVar31 + 1;
    (coder->rc).init_bytes_left = uVar14;
  }
  uVar32 = (coder->rc).range;
  uVar15 = (coder->rc).code;
  sVar31 = *in_pos;
  local_f4 = LZMA_DATA_ERROR;
  sVar27 = sVar7;
  sVar17 = sVar7;
  uVar34 = uVar21;
  uVar36 = uVar22;
  uVar37 = uVar22;
  uVar18 = uVar15;
  uVar19 = uVar15;
  uVar33 = uVar16;
  switch(coder->sequence) {
  case SEQ_INDICATOR:
  case SEQ_BLOCK_HEADER:
    do {
      uVar35 = (uint)uVar37;
      if ((uVar9 != 0xffffffffffffffff) && (sVar17 = sVar28, sVar27 == sVar28))
      goto switchD_00498b9e_default;
      uVar24 = uVar32;
      if (uVar32 < 0x1000000) {
        if (sVar31 == in_size) {
          coder->sequence = SEQ_BLOCK_HEADER;
          sVar31 = in_size;
          sVar28 = sVar27;
          break;
        }
        pbVar1 = in + sVar31;
        sVar31 = sVar31 + 1;
        uVar15 = uVar15 << 8 | (uint)*pbVar1;
        uVar24 = uVar32 << 8;
      }
      ppVar26 = coder->is_match[local_d4] + local_c0;
      uVar2 = *ppVar26;
      uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
      uVar19 = uVar15 - uVar32;
      if (uVar15 < uVar32) {
        *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
        bVar10 = (byte)uVar5;
        sVar17 = 0;
        if (sVar27 == 0) {
          sVar17 = sVar8;
        }
        papVar30 = coder->literal +
                   (ulong)(puVar6[(sVar17 - 1) + sVar27] >> (8 - bVar10 & 0x1f)) +
                   ((ulong)((uint)sVar27 & uVar4) << (bVar10 & 0x3f));
        uVar22 = 1;
        if (local_d4 < STATE_LIT_MATCH) {
switchD_00498b9e_caseD_2:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_BLOCK;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = uVar15 << 8 | (uint)*pbVar1;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar36 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
            uVar36 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_3:
          uVar35 = (uint)uVar36;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_CODER_INIT;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = uVar19 << 8 | (uint)*pbVar1;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar36];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (*papVar30)[uVar36] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar36] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_4:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_CODE;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = uVar15 << 8 | (uint)*pbVar1;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_5:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL3;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = uVar19 << 8 | (uint)*pbVar1;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_6:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_CRC32;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = uVar15 << 8 | (uint)*pbVar1;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_7:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL5;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_8:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL6;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_9:
          uVar35 = (uint)uVar22;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL7;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar24 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar24;
          if (uVar19 < uVar24) {
            (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
            uVar32 = uVar24;
          }
          else {
            uVar32 = uVar32 - uVar24;
            (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
        }
        else {
          sVar17 = 0;
          if (sVar27 <= uVar21) {
            sVar17 = sVar8;
          }
          uVar24 = (uint)puVar6[sVar17 + ~uVar21 + sVar27] * 2;
          uVar16 = 0x100;
          uVar35 = 1;
switchD_00498b9e_caseD_a:
          uVar18 = (uint)uVar21;
          uVar33 = uVar16 & uVar24;
          uVar20 = uVar16 + uVar35 + uVar33;
          uVar19 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED0;
              bVar12 = true;
              local_f4 = LZMA_OK;
              sVar31 = in_size;
              goto LAB_0049c1f4;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar20];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar19 - uVar18;
          if (uVar19 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar33 = uVar33 ^ uVar16;
            uVar15 = uVar19;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar20] = sVar11 + uVar2;
          local_a8 = (ulong)(uVar24 * 2);
switchD_00498b9e_caseD_b:
          uVar16 = uVar33 & (uint)local_a8;
          uVar19 = uVar33 + uVar35 + uVar16;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED1;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar16 = uVar33;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar16 = uVar16 ^ uVar33;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar19] = sVar11 + uVar2;
          local_a8 = (ulong)((uint)local_a8 * 2);
switchD_00498b9e_caseD_c:
          uVar33 = uVar16 & (uint)local_a8;
          uVar19 = uVar16 + uVar35 + uVar33;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED2;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar33 = uVar33 ^ uVar16;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar19] = sVar11 + uVar2;
          local_a8 = (ulong)((uint)local_a8 * 2);
switchD_00498b9e_caseD_d:
          uVar16 = uVar33 & (uint)local_a8;
          uVar19 = uVar33 + uVar35 + uVar16;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED3;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar16 = uVar33;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar16 = uVar16 ^ uVar33;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar19] = sVar11 + uVar2;
          local_a8 = (ulong)((uint)local_a8 * 2);
switchD_00498b9e_caseD_e:
          uVar33 = uVar16 & (uint)local_a8;
          uVar19 = uVar16 + uVar35 + uVar33;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED4;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar33 = uVar33 ^ uVar16;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar19] = sVar11 + uVar2;
          local_a8 = (ulong)((uint)local_a8 * 2);
switchD_00498b9e_caseD_f:
          uVar16 = uVar33 & (uint)local_a8;
          uVar19 = uVar33 + uVar35 + uVar16;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED5;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar16 = uVar33;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar16 = uVar16 ^ uVar33;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar19] = sVar11 + uVar2;
          local_a8 = (ulong)((uint)local_a8 * 2);
switchD_00498b9e_caseD_10:
          uVar33 = uVar16 & (uint)local_a8;
          uVar19 = uVar16 + uVar35 + uVar33;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED6;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar33 = uVar33 ^ uVar16;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar19] = sVar11 + uVar2;
          local_a8 = (ulong)((uint)local_a8 * 2);
switchD_00498b9e_caseD_11:
          uVar16 = uVar33 & (uint)local_a8;
          uVar19 = uVar33 + uVar35 + uVar16;
          uVar24 = uVar15;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_LITERAL_MATCHED7;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar16 = uVar33;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar24 = (uint)*pbVar1 | uVar15 << 8;
          }
          uVar2 = (*papVar30)[uVar19];
          uVar18 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar24 - uVar18;
          if (uVar24 < uVar18) {
            (*papVar30)[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar16 = uVar16 ^ uVar33;
            uVar15 = uVar24;
            uVar32 = uVar18;
          }
          else {
            uVar32 = uVar32 - uVar18;
            (*papVar30)[uVar19] = uVar2 - (uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          uVar37 = (ulong)uVar35;
        }
        local_d4 = lzma_decode::next_state[local_d4];
switchD_00498b9e_caseD_12:
        uVar35 = (uint)uVar37;
        if (sVar27 == sVar28) {
          coder->sequence = SEQ_LITERAL_WRITE;
          break;
        }
        puVar6[sVar27] = (uint8_t)uVar37;
LAB_0049b620:
        sVar27 = sVar27 + 1;
        if (local_b0 < sVar27) {
          local_b0 = sVar27;
        }
      }
      else {
        uVar32 = uVar24 - uVar32;
        *ppVar26 = uVar2 - (uVar2 >> 5);
switchD_00498b9e_caseD_13:
        uVar24 = (uint)local_a8;
        uVar35 = (uint)uVar37;
        uVar18 = (uint)uVar21;
        uVar33 = uVar32;
        uVar15 = uVar19;
        if (uVar32 < 0x1000000) {
          if (sVar31 == in_size) {
            coder->sequence = SEQ_IS_REP;
            bVar13 = false;
            bVar12 = true;
            local_f4 = LZMA_OK;
            sVar31 = in_size;
            goto LAB_0049bb1a;
          }
          pbVar1 = in + sVar31;
          sVar31 = sVar31 + 1;
          uVar33 = uVar32 << 8;
          uVar15 = (uint)*pbVar1 | uVar19 << 8;
        }
        uVar22 = (ulong)local_d4;
        uVar2 = coder->is_rep[uVar22];
        uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
        uVar19 = uVar15 - uVar32;
        if (uVar15 < uVar32) {
          coder->is_rep[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
          local_d4 = (uint)(STATE_SHORTREP_LIT < local_d4) * 3 + STATE_LIT_MATCH;
          uVar22 = 1;
          local_9c = local_b4;
          local_b4 = local_c4;
          local_c4 = uVar18;
switchD_00498b9e_caseD_14:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_MATCH_LEN_CHOICE;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->match_len_decoder).choice;
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (coder->match_len_decoder).choice = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_00498b9e_caseD_15:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_LOW0;
                sVar31 = in_size;
                sVar28 = sVar27;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar24 = uVar32 << 8;
            }
            ppVar26 = (coder->match_len_decoder).low[local_c0] + uVar22;
            uVar2 = *ppVar26;
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar22 = (ulong)(uVar35 * 2);
            uVar19 = uVar15 - uVar32;
            if (uVar15 < uVar32) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar15;
            }
            else {
              uVar32 = uVar24 - uVar32;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar35 * 2 | 1);
            }
switchD_00498b9e_caseD_16:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_LOW1;
                sVar31 = in_size;
                sVar28 = sVar27;
                uVar15 = uVar19;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar24 = uVar32 << 8;
            }
            ppVar26 = (coder->match_len_decoder).low[local_c0] + uVar22;
            uVar2 = *ppVar26;
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar22 = (ulong)(uVar35 * 2);
            uVar18 = uVar19 - uVar32;
            if (uVar19 < uVar32) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar18 = uVar19;
            }
            else {
              uVar32 = uVar24 - uVar32;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar35 * 2 | 1);
            }
switchD_00498b9e_caseD_17:
            uVar35 = (uint)uVar22;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_LOW2;
                sVar31 = in_size;
                sVar28 = sVar27;
                uVar15 = uVar18;
                break;
              }
              uVar32 = uVar32 << 8;
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar18 = (uint)*pbVar1 | uVar18 << 8;
            }
            ppVar26 = (coder->match_len_decoder).low[local_c0] + uVar22;
            uVar2 = *ppVar26;
            uVar24 = (uVar32 >> 0xb) * (uint)uVar2;
            uVar35 = uVar35 * 2;
            uVar15 = uVar18 - uVar24;
            if (uVar18 < uVar24) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar18;
            }
            else {
              uVar24 = uVar32 - uVar24;
              sVar11 = -(uVar2 >> 5);
              uVar35 = uVar35 | 1;
            }
            *ppVar26 = sVar11 + uVar2;
            uVar35 = uVar35 - 6;
            uVar32 = uVar24;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->match_len_decoder).choice = uVar2 - (uVar2 >> 5);
switchD_00498b9e_caseD_18:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            uVar15 = uVar19;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_CHOICE2;
                sVar31 = in_size;
                sVar28 = sVar27;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar24 = uVar32 << 8;
              uVar15 = (uint)*pbVar1 | uVar19 << 8;
            }
            uVar2 = (coder->match_len_decoder).choice2;
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar19 = uVar15 - uVar32;
            if (uVar15 < uVar32) {
              (coder->match_len_decoder).choice2 = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_00498b9e_caseD_19:
              uVar35 = (uint)uVar22;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_MID0;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar24 = uVar32 << 8;
              }
              ppVar26 = (coder->match_len_decoder).mid[local_c0] + uVar22;
              uVar2 = *ppVar26;
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar22 = (ulong)(uVar35 * 2);
              uVar19 = uVar15 - uVar32;
              if (uVar15 < uVar32) {
                *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar15;
              }
              else {
                uVar32 = uVar24 - uVar32;
                *ppVar26 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_1a:
              uVar35 = (uint)uVar22;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_MID1;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar19;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar24 = uVar32 << 8;
              }
              ppVar26 = (coder->match_len_decoder).mid[local_c0] + uVar22;
              uVar2 = *ppVar26;
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar22 = (ulong)(uVar35 * 2);
              uVar18 = uVar19 - uVar32;
              if (uVar19 < uVar32) {
                *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar18 = uVar19;
              }
              else {
                uVar32 = uVar24 - uVar32;
                *ppVar26 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_1b:
              uVar35 = (uint)uVar22;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_MID2;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar18;
                  break;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar18 = (uint)*pbVar1 | uVar18 << 8;
              }
              ppVar26 = (coder->match_len_decoder).mid[local_c0] + uVar22;
              uVar2 = *ppVar26;
              uVar24 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar35 = uVar35 * 2;
              uVar15 = uVar18 - uVar24;
              if (uVar18 < uVar24) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar15 = uVar18;
                uVar32 = uVar24;
              }
              else {
                uVar32 = uVar32 - uVar24;
                sVar11 = -(uVar2 >> 5);
                uVar35 = uVar35 | 1;
              }
              *ppVar26 = sVar11 + uVar2;
              uVar35 = uVar35 + 2;
            }
            else {
              uVar32 = uVar24 - uVar32;
              (coder->match_len_decoder).choice2 = uVar2 - (uVar2 >> 5);
              uVar37 = uVar22;
switchD_00498b9e_caseD_1c:
              uVar35 = (uint)uVar37;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH0;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar19;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar37];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar22 = (ulong)(uVar35 * 2);
              uVar15 = uVar19 - uVar32;
              if (uVar19 < uVar32) {
                (coder->match_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar15 = uVar19;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_1d:
              uVar35 = (uint)uVar22;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH1;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar22];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar37 = (ulong)(uVar35 * 2);
              uVar19 = uVar15 - uVar32;
              if (uVar15 < uVar32) {
                (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar15;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar37 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_1e:
              uVar35 = (uint)uVar37;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH2;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar19;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar37];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar22 = (ulong)(uVar35 * 2);
              uVar15 = uVar19 - uVar32;
              if (uVar19 < uVar32) {
                (coder->match_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar15 = uVar19;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_1f:
              uVar35 = (uint)uVar22;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH3;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar22];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar37 = (ulong)(uVar35 * 2);
              uVar19 = uVar15 - uVar32;
              if (uVar15 < uVar32) {
                (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar15;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar37 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_20:
              uVar35 = (uint)uVar37;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH4;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar19;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar37];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar22 = (ulong)(uVar35 * 2);
              uVar15 = uVar19 - uVar32;
              if (uVar19 < uVar32) {
                (coder->match_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar15 = uVar19;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_21:
              uVar35 = (uint)uVar22;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH5;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar22];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar37 = (ulong)(uVar35 * 2);
              uVar19 = uVar15 - uVar32;
              if (uVar15 < uVar32) {
                (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar19 = uVar15;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar37 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_22:
              uVar35 = (uint)uVar37;
              uVar24 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH6;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar19;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar19 = (uint)*pbVar1 | uVar19 << 8;
                uVar24 = uVar32 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar37];
              uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
              uVar22 = (ulong)(uVar35 * 2);
              uVar18 = uVar19 - uVar32;
              if (uVar19 < uVar32) {
                (coder->match_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar18 = uVar19;
              }
              else {
                uVar32 = uVar24 - uVar32;
                (coder->match_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar35 * 2 | 1);
              }
switchD_00498b9e_caseD_23:
              uVar35 = (uint)uVar22;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_HIGH7;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar15 = uVar18;
                  break;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar18 = (uint)*pbVar1 | uVar18 << 8;
              }
              uVar2 = (coder->match_len_decoder).high[uVar22];
              uVar24 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar35 = uVar35 * 2;
              uVar15 = uVar18 - uVar24;
              if (uVar18 < uVar24) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar15 = uVar18;
                uVar32 = uVar24;
              }
              else {
                uVar32 = uVar32 - uVar24;
                sVar11 = -(uVar2 >> 5);
                uVar35 = uVar35 | 1;
              }
              (coder->match_len_decoder).high[uVar22] = sVar11 + uVar2;
              uVar35 = uVar35 - 0xee;
            }
          }
          local_a8 = (ulong)uVar35;
          uVar22 = 3;
          if (uVar35 < 6) {
            uVar22 = (ulong)(uVar35 - 2);
          }
          papVar30 = (probability (*) [768])(coder->pos_slot + uVar22);
          uVar37 = 1;
switchD_00498b9e_caseD_24:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_POS_SLOT0;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_25:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_POS_SLOT1;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_26:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_POS_SLOT2;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_27:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_POS_SLOT3;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_28:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_POS_SLOT4;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (*papVar30)[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (*papVar30)[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_29:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_POS_SLOT5;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (*papVar30)[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          (*papVar30)[uVar22] = sVar11 + uVar2;
          uVar24 = uVar35 - 0x40;
          uVar34 = (ulong)uVar24;
          if (0x3f < uVar24) {
            __assert_fail("symbol <= 63",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x213,
                          "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          uVar37 = uVar34;
          if (uVar24 < 4) {
switchD_0049ad1b_default:
            uVar35 = (uint)uVar37;
            uVar21 = uVar34;
            if (uVar34 < local_b0) goto LAB_0049b952;
          }
          else {
            uVar29 = (uVar24 >> 1) - 1;
            uVar33 = uVar35 & 1 | 2;
            uVar21 = (ulong)uVar33;
            if (uVar24 < 0xe) {
              if (5 < uVar29) {
                __assert_fail("limit <= 5",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x222,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              uVar33 = uVar33 << ((byte)uVar29 & 0x1f);
              uVar21 = (ulong)uVar33;
              if ((int)(uVar33 - uVar35) < -0x40) {
                __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x22c,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              if (0x13 < (int)(uVar33 - uVar35)) {
                __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x22e,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              papVar30 = (probability (*) [768])
                         ((long)coder + uVar34 * -2 + (ulong)uVar33 * 2 + 0x655e);
              uVar16 = 0;
              uVar22 = 1;
switchD_00498b9e_caseD_2a:
              uVar35 = (uint)uVar22;
              uVar34 = uVar21;
              uVar37 = uVar22;
              uVar36 = uVar22;
              uVar24 = uVar15;
              switch(uVar29) {
              case 1:
                goto switchD_0049ad1b_caseD_1;
              case 2:
                goto switchD_0049ad1b_caseD_2;
              case 3:
                goto switchD_0049ad1b_caseD_3;
              case 4:
                break;
              case 5:
                if (uVar16 != 0) {
                  __assert_fail("offset == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x23d,
                                "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                uVar24 = uVar15;
                uVar16 = uVar32;
                if (uVar32 < 0x1000000) {
                  if (sVar31 == in_size) {
                    coder->sequence = SEQ_POS_MODEL;
                    uVar29 = 5;
                    sVar31 = in_size;
                    sVar28 = sVar27;
                    uVar16 = 0;
                    goto LAB_0049bb12;
                  }
                  pbVar1 = in + sVar31;
                  sVar31 = sVar31 + 1;
                  uVar24 = (uint)*pbVar1 | uVar15 << 8;
                  uVar16 = uVar32 << 8;
                }
                uVar2 = (*papVar30)[uVar22];
                uVar32 = (uVar16 >> 0xb) * (uint)uVar2;
                uVar15 = uVar24 - uVar32;
                if (uVar24 < uVar32) {
                  (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar16 = 1;
                  uVar22 = (ulong)(uVar35 * 2);
                  uVar15 = uVar24;
                }
                else {
                  uVar32 = uVar16 - uVar32;
                  (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar35 * 2 | 1);
                  uVar21 = (ulong)((int)uVar21 + 1);
                  uVar16 = 1;
                }
                break;
              default:
                goto switchD_0049ad1b_default;
              }
              uVar35 = (uint)uVar22;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_POS_MODEL;
                  uVar29 = 4;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  break;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
              }
              uVar2 = (*papVar30)[uVar22];
              uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar35 = uVar35 * 2;
              uVar24 = uVar15 - uVar33;
              if (uVar15 < uVar33) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar24 = uVar15;
                uVar32 = uVar33;
              }
              else {
                uVar32 = uVar32 - uVar33;
                sVar11 = -(uVar2 >> 5);
                uVar35 = uVar35 | 1;
                uVar21 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar21);
              }
              uVar36 = (ulong)uVar35;
              (*papVar30)[uVar22] = sVar11 + uVar2;
              uVar16 = uVar16 + 1;
              uVar34 = uVar21;
switchD_0049ad1b_caseD_3:
              uVar35 = (uint)uVar36;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_POS_MODEL;
                  uVar29 = 3;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar21 = uVar34;
                  uVar15 = uVar24;
                  break;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar24 = (uint)*pbVar1 | uVar24 << 8;
              }
              uVar2 = (*papVar30)[uVar36];
              uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar35 = uVar35 * 2;
              uVar15 = uVar24 - uVar33;
              if (uVar24 < uVar33) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar15 = uVar24;
                uVar32 = uVar33;
              }
              else {
                uVar32 = uVar32 - uVar33;
                sVar11 = -(uVar2 >> 5);
                uVar35 = uVar35 | 1;
                uVar34 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar34);
              }
              uVar37 = (ulong)uVar35;
              (*papVar30)[uVar36] = sVar11 + uVar2;
              uVar16 = uVar16 + 1;
switchD_0049ad1b_caseD_2:
              uVar35 = (uint)uVar37;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_POS_MODEL;
                  uVar29 = 2;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar21 = uVar34;
                  break;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = (uint)*pbVar1 | uVar15 << 8;
              }
              uVar2 = (*papVar30)[uVar37];
              uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
              uVar35 = uVar35 * 2;
              uVar24 = uVar15 - uVar33;
              if (uVar15 < uVar33) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar24 = uVar15;
                uVar32 = uVar33;
              }
              else {
                uVar32 = uVar32 - uVar33;
                sVar11 = -(uVar2 >> 5);
                uVar35 = uVar35 | 1;
                uVar34 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar34);
              }
              uVar22 = (ulong)uVar35;
              (*papVar30)[uVar37] = sVar11 + uVar2;
              uVar16 = uVar16 + 1;
switchD_0049ad1b_caseD_1:
              uVar35 = (uint)uVar22;
              uVar33 = uVar32;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_POS_MODEL;
                  uVar29 = 1;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  uVar21 = uVar34;
                  uVar15 = uVar24;
                  break;
                }
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar24 = (uint)*pbVar1 | uVar24 << 8;
                uVar33 = uVar32 << 8;
              }
              uVar2 = (*papVar30)[uVar22];
              uVar32 = (uVar33 >> 0xb) * (uint)uVar2;
              uVar15 = uVar24 - uVar32;
              uVar37 = uVar22;
              if (uVar24 < uVar32) {
                (*papVar30)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar29 = 1;
                uVar15 = uVar24;
              }
              else {
                uVar32 = uVar33 - uVar32;
                (*papVar30)[uVar22] = uVar2 - (uVar2 >> 5);
                uVar29 = 1;
                uVar34 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar34);
              }
              goto switchD_0049ad1b_default;
            }
            if (uVar29 < 6) {
              __assert_fail("limit >= 6",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x266,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            uVar29 = (uVar24 >> 1) - 5;
            uVar22 = uVar34;
switchD_00498b9e_caseD_2b:
            do {
              uVar35 = (uint)uVar22;
              if (uVar32 < 0x1000000) {
                if (sVar31 == in_size) {
                  coder->sequence = SEQ_DIRECT;
                  sVar31 = in_size;
                  sVar28 = sVar27;
                  goto LAB_0049bb12;
                }
                uVar32 = uVar32 << 8;
                pbVar1 = in + sVar31;
                sVar31 = sVar31 + 1;
                uVar15 = uVar15 << 8 | (uint)*pbVar1;
              }
              uVar32 = uVar32 >> 1;
              uVar35 = (int)(uVar15 - uVar32) >> 0x1f;
              uVar24 = uVar35 + (int)uVar21 * 2 + 1;
              uVar21 = (ulong)uVar24;
              uVar15 = (uVar35 & uVar32) + (uVar15 - uVar32);
              uVar29 = uVar29 - 1;
            } while (uVar29 != 0);
            uVar21 = (ulong)(uVar24 * 0x10);
            uVar29 = 0;
            uVar22 = 1;
switchD_00498b9e_caseD_2c:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_ALIGN0;
                sVar31 = in_size;
                sVar28 = sVar27;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar24 = uVar32 << 8;
            }
            uVar2 = coder->pos_align[uVar22];
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar36 = (ulong)(uVar35 * 2);
            uVar19 = uVar15 - uVar32;
            if (uVar15 < uVar32) {
              coder->pos_align[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar15;
            }
            else {
              uVar32 = uVar24 - uVar32;
              coder->pos_align[uVar22] = uVar2 - (uVar2 >> 5);
              uVar36 = (ulong)(uVar35 * 2 | 1);
              uVar21 = (ulong)((int)uVar21 + 1);
            }
switchD_00498b9e_caseD_2d:
            uVar35 = (uint)uVar36;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_ALIGN1;
                sVar31 = in_size;
                sVar28 = sVar27;
                uVar15 = uVar19;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar24 = uVar32 << 8;
            }
            uVar2 = coder->pos_align[uVar36];
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar37 = (ulong)(uVar35 * 2);
            uVar15 = uVar19 - uVar32;
            if (uVar19 < uVar32) {
              coder->pos_align[uVar36] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar19;
            }
            else {
              uVar32 = uVar24 - uVar32;
              coder->pos_align[uVar36] = uVar2 - (uVar2 >> 5);
              uVar37 = (ulong)(uVar35 * 2 | 1);
              uVar21 = (ulong)((int)uVar21 + 2);
            }
switchD_00498b9e_caseD_2e:
            uVar35 = (uint)uVar37;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_ALIGN2;
                sVar31 = in_size;
                sVar28 = sVar27;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar24 = uVar32 << 8;
            }
            uVar2 = coder->pos_align[uVar37];
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar22 = (ulong)(uVar35 * 2);
            uVar19 = uVar15 - uVar32;
            if (uVar15 < uVar32) {
              coder->pos_align[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar15;
            }
            else {
              uVar32 = uVar24 - uVar32;
              coder->pos_align[uVar37] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar35 * 2 | 1);
              uVar21 = (ulong)((int)uVar21 + 4);
            }
switchD_00498b9e_caseD_2f:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_ALIGN3;
                sVar31 = in_size;
                sVar28 = sVar27;
                uVar15 = uVar19;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar24 = uVar32 << 8;
            }
            uVar2 = coder->pos_align[uVar22];
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar15 = uVar19 - uVar32;
            if (uVar19 < uVar32) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar34 = uVar21;
              uVar15 = uVar19;
            }
            else {
              uVar32 = uVar24 - uVar32;
              sVar11 = -(uVar2 >> 5);
              uVar34 = (ulong)((int)uVar21 + 8);
            }
            coder->pos_align[uVar22] = sVar11 + uVar2;
            uVar37 = uVar22;
            if ((int)uVar34 != -1) goto switchD_0049ad1b_default;
            uVar34 = 0xffffffffffffffff;
            if (coder->uncompressed_size == 0xffffffffffffffff) goto switchD_00498b9e_caseD_30;
          }
          uVar24 = (uint)local_a8;
          uVar18 = (uint)uVar34;
          bVar12 = false;
          bVar13 = false;
          goto LAB_0049bb1a;
        }
        uVar32 = uVar33 - uVar32;
        coder->is_rep[uVar22] = uVar2 - (uVar2 >> 5);
        if (local_b0 == 0) {
          bVar12 = false;
          local_b0 = 0;
LAB_0049c1f4:
          bVar13 = false;
          uVar15 = uVar19;
          goto LAB_0049bb1a;
        }
switchD_00498b9e_caseD_31:
        uVar35 = (uint)uVar37;
        uVar15 = uVar19;
        uVar24 = uVar32;
        if (uVar32 < 0x1000000) {
          if (sVar31 == in_size) {
            coder->sequence = SEQ_IS_REP0;
            sVar31 = in_size;
            sVar28 = sVar27;
            break;
          }
          pbVar1 = in + sVar31;
          sVar31 = sVar31 + 1;
          uVar15 = (uint)*pbVar1 | uVar19 << 8;
          uVar24 = uVar32 << 8;
        }
        uVar22 = (ulong)local_d4;
        uVar2 = coder->is_rep0[uVar22];
        uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
        uVar19 = uVar15 - uVar32;
        if (uVar15 < uVar32) {
          coder->is_rep0[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_00498b9e_caseD_33:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_IS_REP0_LONG;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          ppVar26 = coder->is_rep0_long[local_d4] + local_c0;
          uVar2 = *ppVar26;
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          if (uVar15 < uVar32) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            local_d4 = (uint)(STATE_SHORTREP_LIT < local_d4) * 2 + STATE_LIT_SHORTREP;
switchD_00498b9e_caseD_32:
            uVar35 = (uint)uVar37;
            if (sVar27 != sVar28) {
              sVar17 = 0;
              if (sVar27 <= uVar21) {
                sVar17 = sVar8;
              }
              puVar6[sVar27] = puVar6[sVar17 + sVar27 + ~uVar21];
              goto LAB_0049b620;
            }
            coder->sequence = SEQ_SHORTREP;
            break;
          }
          *ppVar26 = uVar2 - (uVar2 >> 5);
          uVar15 = uVar15 - uVar32;
          uVar32 = uVar24 - uVar32;
          uVar33 = (uint)uVar21;
          uVar24 = local_c4;
        }
        else {
          uVar32 = uVar24 - uVar32;
          coder->is_rep0[uVar22] = uVar2 - (uVar2 >> 5);
switchD_00498b9e_caseD_34:
          uVar24 = (uint)uVar21;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_IS_REP1;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
          }
          uVar22 = (ulong)local_d4;
          uVar2 = coder->is_rep1[uVar22];
          uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar15 = uVar19 - uVar33;
          if (uVar19 < uVar33) {
            coder->is_rep1[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
            uVar32 = uVar33;
            uVar33 = local_c4;
          }
          else {
            uVar32 = uVar32 - uVar33;
            coder->is_rep1[uVar22] = uVar2 - (uVar2 >> 5);
switchD_00498b9e_caseD_35:
            uVar33 = local_9c;
            uVar24 = (uint)uVar21;
            uVar19 = uVar15;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_IS_REP2;
                sVar31 = in_size;
                sVar28 = sVar27;
                break;
              }
              uVar32 = uVar32 << 8;
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar19 = (uint)*pbVar1 | uVar15 << 8;
            }
            uVar22 = (ulong)local_d4;
            uVar2 = coder->is_rep2[uVar22];
            uVar35 = (uVar32 >> 0xb) * (uint)uVar2;
            uVar15 = uVar19 - uVar35;
            if (uVar19 < uVar35) {
              coder->is_rep2[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar15 = uVar19;
              uVar32 = uVar35;
              uVar33 = local_b4;
              local_b4 = local_c4;
            }
            else {
              uVar32 = uVar32 - uVar35;
              coder->is_rep2[uVar22] = uVar2 - (uVar2 >> 5);
              local_9c = local_b4;
              local_b4 = local_c4;
            }
          }
        }
        local_d4 = (uint)(STATE_SHORTREP_LIT < local_d4) * 3 + STATE_LIT_LONGREP;
        uVar21 = (ulong)uVar33;
        uVar22 = 1;
        local_c4 = uVar24;
switchD_00498b9e_caseD_36:
        uVar35 = (uint)uVar22;
        uVar24 = uVar32;
        if (uVar32 < 0x1000000) {
          if (sVar31 == in_size) {
            coder->sequence = SEQ_REP_LEN_CHOICE;
            sVar31 = in_size;
            sVar28 = sVar27;
            break;
          }
          pbVar1 = in + sVar31;
          sVar31 = sVar31 + 1;
          uVar15 = (uint)*pbVar1 | uVar15 << 8;
          uVar24 = uVar32 << 8;
        }
        uVar2 = (coder->rep_len_decoder).choice;
        uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
        uVar19 = uVar15 - uVar32;
        if (uVar15 < uVar32) {
          (coder->rep_len_decoder).choice = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_00498b9e_caseD_37:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_LOW0;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          ppVar26 = (coder->rep_len_decoder).low[local_c0] + uVar22;
          uVar2 = *ppVar26;
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            *ppVar26 = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_38:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_LOW1;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          ppVar26 = (coder->rep_len_decoder).low[local_c0] + uVar22;
          uVar2 = *ppVar26;
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar18 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar18 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            *ppVar26 = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_39:
          uVar35 = (uint)uVar22;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_LOW2;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar18;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar18 = (uint)*pbVar1 | uVar18 << 8;
          }
          ppVar26 = (coder->rep_len_decoder).low[local_c0] + uVar22;
          uVar2 = *ppVar26;
          uVar33 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar18 - uVar33;
          if (uVar18 < uVar33) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar15 = uVar18;
          }
          else {
            uVar33 = uVar32 - uVar33;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          *ppVar26 = sVar11 + uVar2;
          uVar24 = uVar35 - 6;
          uVar32 = uVar33;
LAB_0049ac8d:
          uVar37 = (ulong)uVar35;
          local_a8 = (ulong)uVar24;
        }
        else {
          uVar32 = uVar24 - uVar32;
          (coder->rep_len_decoder).choice = uVar2 - (uVar2 >> 5);
switchD_00498b9e_caseD_3a:
          uVar35 = (uint)uVar22;
          uVar15 = uVar19;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_CHOICE2;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).choice2;
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (coder->rep_len_decoder).choice2 = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_00498b9e_caseD_3b:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_REP_LEN_MID0;
                sVar31 = in_size;
                sVar28 = sVar27;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar15 = (uint)*pbVar1 | uVar15 << 8;
              uVar24 = uVar32 << 8;
            }
            ppVar26 = (coder->rep_len_decoder).mid[local_c0] + uVar22;
            uVar2 = *ppVar26;
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar22 = (ulong)(uVar35 * 2);
            uVar19 = uVar15 - uVar32;
            if (uVar15 < uVar32) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar19 = uVar15;
            }
            else {
              uVar32 = uVar24 - uVar32;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar35 * 2 | 1);
            }
switchD_00498b9e_caseD_3c:
            uVar35 = (uint)uVar22;
            uVar24 = uVar32;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_REP_LEN_MID1;
                sVar31 = in_size;
                sVar28 = sVar27;
                uVar15 = uVar19;
                break;
              }
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar19 = (uint)*pbVar1 | uVar19 << 8;
              uVar24 = uVar32 << 8;
            }
            ppVar26 = (coder->rep_len_decoder).mid[local_c0] + uVar22;
            uVar2 = *ppVar26;
            uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
            uVar22 = (ulong)(uVar35 * 2);
            uVar18 = uVar19 - uVar32;
            if (uVar19 < uVar32) {
              *ppVar26 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar18 = uVar19;
            }
            else {
              uVar32 = uVar24 - uVar32;
              *ppVar26 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar35 * 2 | 1);
            }
switchD_00498b9e_caseD_3d:
            uVar35 = (uint)uVar22;
            if (uVar32 < 0x1000000) {
              if (sVar31 == in_size) {
                coder->sequence = SEQ_REP_LEN_MID2;
                sVar31 = in_size;
                sVar28 = sVar27;
                uVar15 = uVar18;
                break;
              }
              uVar32 = uVar32 << 8;
              pbVar1 = in + sVar31;
              sVar31 = sVar31 + 1;
              uVar18 = (uint)*pbVar1 | uVar18 << 8;
            }
            ppVar26 = (coder->rep_len_decoder).mid[local_c0] + uVar22;
            uVar2 = *ppVar26;
            uVar24 = (uVar32 >> 0xb) * (uint)uVar2;
            uVar35 = uVar35 * 2;
            uVar15 = uVar18 - uVar24;
            if (uVar18 < uVar24) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar18;
              uVar32 = uVar24;
            }
            else {
              uVar32 = uVar32 - uVar24;
              sVar11 = -(uVar2 >> 5);
              uVar35 = uVar35 | 1;
            }
            *ppVar26 = sVar11 + uVar2;
            uVar24 = uVar35 + 2;
            goto LAB_0049ac8d;
          }
          uVar32 = uVar24 - uVar32;
          (coder->rep_len_decoder).choice2 = uVar2 - (uVar2 >> 5);
          uVar37 = uVar22;
switchD_00498b9e_caseD_3e:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH0;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (coder->rep_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_3f:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH1;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_40:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH2;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (coder->rep_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_41:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH3;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_42:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH4;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar15 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (coder->rep_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar15 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_43:
          uVar35 = (uint)uVar22;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH5;
              sVar31 = in_size;
              sVar28 = sVar27;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar15 = (uint)*pbVar1 | uVar15 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar22];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar37 = (ulong)(uVar35 * 2);
          uVar19 = uVar15 - uVar32;
          if (uVar15 < uVar32) {
            (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar19 = uVar15;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
            uVar37 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_44:
          uVar35 = (uint)uVar37;
          uVar24 = uVar32;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH6;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar19;
              break;
            }
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar19 = (uint)*pbVar1 | uVar19 << 8;
            uVar24 = uVar32 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar37];
          uVar32 = (uVar24 >> 0xb) * (uint)uVar2;
          uVar22 = (ulong)(uVar35 * 2);
          uVar18 = uVar19 - uVar32;
          if (uVar19 < uVar32) {
            (coder->rep_len_decoder).high[uVar37] = (short)(0x800 - uVar2 >> 5) + uVar2;
            uVar18 = uVar19;
          }
          else {
            uVar32 = uVar24 - uVar32;
            (coder->rep_len_decoder).high[uVar37] = uVar2 - (uVar2 >> 5);
            uVar22 = (ulong)(uVar35 * 2 | 1);
          }
switchD_00498b9e_caseD_45:
          uVar35 = (uint)uVar22;
          if (uVar32 < 0x1000000) {
            if (sVar31 == in_size) {
              coder->sequence = SEQ_REP_LEN_HIGH7;
              sVar31 = in_size;
              sVar28 = sVar27;
              uVar15 = uVar18;
              break;
            }
            uVar32 = uVar32 << 8;
            pbVar1 = in + sVar31;
            sVar31 = sVar31 + 1;
            uVar18 = (uint)*pbVar1 | uVar18 << 8;
          }
          uVar2 = (coder->rep_len_decoder).high[uVar22];
          uVar24 = (uVar32 >> 0xb) * (uint)uVar2;
          uVar35 = uVar35 * 2;
          uVar15 = uVar18 - uVar24;
          if (uVar18 < uVar24) {
            sVar11 = (short)(0x800 - uVar2 >> 5);
            uVar15 = uVar18;
            uVar32 = uVar24;
          }
          else {
            uVar32 = uVar32 - uVar24;
            sVar11 = -(uVar2 >> 5);
            uVar35 = uVar35 | 1;
          }
          uVar37 = (ulong)uVar35;
          (coder->rep_len_decoder).high[uVar22] = sVar11 + uVar2;
          local_a8 = (ulong)(uVar35 - 0xee);
        }
LAB_0049b952:
        if ((uint)local_a8 < 2) {
          __assert_fail("len >= MATCH_LEN_MIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x312,
                        "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
        if (0x111 < (uint)local_a8) {
          __assert_fail("len <= MATCH_LEN_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                        ,0x313,
                        "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                       );
        }
switchD_00498b9e_caseD_46:
        uVar35 = (uint)uVar37;
        uVar22 = sVar28 - sVar27;
        if (local_a8 <= sVar28 - sVar27) {
          uVar22 = local_a8;
        }
        uVar34 = uVar22 & 0xffffffff;
        uVar33 = (uint)uVar22;
        uVar24 = (int)local_a8 - uVar33;
        uVar18 = (uint)uVar21;
        if (uVar18 < uVar33) {
          do {
            sVar17 = sVar8;
            if (uVar21 < sVar27) {
              sVar17 = 0;
            }
            puVar6[sVar27] = puVar6[sVar27 + sVar17 + ~uVar21];
            sVar27 = sVar27 + 1;
            uVar33 = (int)uVar34 - 1;
            uVar34 = (ulong)uVar33;
          } while (uVar33 != 0);
        }
        else {
          if (uVar21 < sVar27) {
            __dest = puVar6 + sVar27;
            __src = __dest + ~uVar21;
LAB_0049ba60:
            memcpy(__dest,__src,uVar34);
          }
          else {
            if (local_b0 != sVar8) {
              __assert_fail("dict->full == dict->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                            ,0xa0,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
            }
            iVar25 = ~uVar18 + (int)sVar27;
            uVar19 = -iVar25;
            if (uVar19 < uVar33) {
              memmove(puVar6 + sVar27,puVar6 + (uint)((int)sVar8 + iVar25),(ulong)uVar19);
              sVar27 = sVar27 + uVar19;
              uVar34 = (ulong)(uVar33 + iVar25);
              __dest = puVar6 + sVar27;
              __src = puVar6;
              goto LAB_0049ba60;
            }
            memmove(puVar6 + sVar27,puVar6 + (uint)((int)sVar8 + iVar25),uVar34);
          }
          sVar27 = sVar27 + uVar34;
        }
        if (local_b0 <= sVar27) {
          local_b0 = sVar27;
        }
        if (uVar24 != 0) goto LAB_0049bc8f;
        local_a8 = 0;
      }
      local_c0 = (ulong)(uVar3 & (uint)sVar27);
    } while( true );
  case SEQ_BLOCK:
    goto switchD_00498b9e_caseD_2;
  case SEQ_CODER_INIT:
    goto switchD_00498b9e_caseD_3;
  case SEQ_CODE:
    goto switchD_00498b9e_caseD_4;
  case SEQ_LITERAL3:
    goto switchD_00498b9e_caseD_5;
  case SEQ_CRC32:
    goto switchD_00498b9e_caseD_6;
  case SEQ_LITERAL5:
    goto switchD_00498b9e_caseD_7;
  case SEQ_LITERAL6:
    goto switchD_00498b9e_caseD_8;
  case SEQ_LITERAL7:
    goto switchD_00498b9e_caseD_9;
  case SEQ_LITERAL_MATCHED0:
    goto switchD_00498b9e_caseD_a;
  case SEQ_LITERAL_MATCHED1:
    goto switchD_00498b9e_caseD_b;
  case SEQ_LITERAL_MATCHED2:
    goto switchD_00498b9e_caseD_c;
  case SEQ_LITERAL_MATCHED3:
    goto switchD_00498b9e_caseD_d;
  case SEQ_LITERAL_MATCHED4:
    goto switchD_00498b9e_caseD_e;
  case SEQ_LITERAL_MATCHED5:
    goto switchD_00498b9e_caseD_f;
  case SEQ_LITERAL_MATCHED6:
    goto switchD_00498b9e_caseD_10;
  case SEQ_LITERAL_MATCHED7:
    goto switchD_00498b9e_caseD_11;
  case SEQ_LITERAL_WRITE:
    goto switchD_00498b9e_caseD_12;
  case SEQ_IS_REP:
    goto switchD_00498b9e_caseD_13;
  case SEQ_MATCH_LEN_CHOICE:
    goto switchD_00498b9e_caseD_14;
  case SEQ_MATCH_LEN_LOW0:
    goto switchD_00498b9e_caseD_15;
  case SEQ_MATCH_LEN_LOW1:
    goto switchD_00498b9e_caseD_16;
  case SEQ_MATCH_LEN_LOW2:
    goto switchD_00498b9e_caseD_17;
  case SEQ_MATCH_LEN_CHOICE2:
    goto switchD_00498b9e_caseD_18;
  case SEQ_MATCH_LEN_MID0:
    goto switchD_00498b9e_caseD_19;
  case SEQ_MATCH_LEN_MID1:
    goto switchD_00498b9e_caseD_1a;
  case SEQ_MATCH_LEN_MID2:
    goto switchD_00498b9e_caseD_1b;
  case SEQ_MATCH_LEN_HIGH0:
    goto switchD_00498b9e_caseD_1c;
  case SEQ_MATCH_LEN_HIGH1:
    goto switchD_00498b9e_caseD_1d;
  case SEQ_MATCH_LEN_HIGH2:
    goto switchD_00498b9e_caseD_1e;
  case SEQ_MATCH_LEN_HIGH3:
    goto switchD_00498b9e_caseD_1f;
  case SEQ_MATCH_LEN_HIGH4:
    goto switchD_00498b9e_caseD_20;
  case SEQ_MATCH_LEN_HIGH5:
    goto switchD_00498b9e_caseD_21;
  case SEQ_MATCH_LEN_HIGH6:
    goto switchD_00498b9e_caseD_22;
  case SEQ_MATCH_LEN_HIGH7:
    goto switchD_00498b9e_caseD_23;
  case SEQ_POS_SLOT0:
    goto switchD_00498b9e_caseD_24;
  case SEQ_POS_SLOT1:
    goto switchD_00498b9e_caseD_25;
  case SEQ_POS_SLOT2:
    goto switchD_00498b9e_caseD_26;
  case SEQ_POS_SLOT3:
    goto switchD_00498b9e_caseD_27;
  case SEQ_POS_SLOT4:
    goto switchD_00498b9e_caseD_28;
  case SEQ_POS_SLOT5:
    goto switchD_00498b9e_caseD_29;
  case SEQ_POS_MODEL:
    goto switchD_00498b9e_caseD_2a;
  case SEQ_DIRECT:
    goto switchD_00498b9e_caseD_2b;
  case SEQ_ALIGN0:
    goto switchD_00498b9e_caseD_2c;
  case SEQ_ALIGN1:
    goto switchD_00498b9e_caseD_2d;
  case SEQ_ALIGN2:
    goto switchD_00498b9e_caseD_2e;
  case SEQ_ALIGN3:
    goto switchD_00498b9e_caseD_2f;
  case SEQ_EOPM:
switchD_00498b9e_caseD_30:
    uVar24 = (uint)local_a8;
    uVar18 = (uint)uVar34;
    bVar13 = true;
    local_f4 = LZMA_STREAM_END;
    if (0xffffff < uVar32) {
      bVar12 = false;
      goto LAB_0049bb1a;
    }
    if (sVar31 != in_size) {
      uVar32 = uVar32 << 8;
      pbVar1 = in + sVar31;
      bVar12 = false;
      sVar31 = sVar31 + 1;
      uVar15 = (uint)*pbVar1 | uVar15 << 8;
      goto LAB_0049bb1a;
    }
    coder->sequence = SEQ_EOPM;
    sVar31 = in_size;
    sVar28 = sVar27;
    uVar21 = uVar34;
    break;
  case SEQ_IS_REP0:
    goto switchD_00498b9e_caseD_31;
  case SEQ_SHORTREP:
    goto switchD_00498b9e_caseD_32;
  case SEQ_IS_REP0_LONG:
    goto switchD_00498b9e_caseD_33;
  case SEQ_IS_REP1:
    goto switchD_00498b9e_caseD_34;
  case SEQ_IS_REP2:
    goto switchD_00498b9e_caseD_35;
  case SEQ_REP_LEN_CHOICE:
    goto switchD_00498b9e_caseD_36;
  case SEQ_REP_LEN_LOW0:
    goto switchD_00498b9e_caseD_37;
  case SEQ_REP_LEN_LOW1:
    goto switchD_00498b9e_caseD_38;
  case SEQ_REP_LEN_LOW2:
    goto switchD_00498b9e_caseD_39;
  case SEQ_REP_LEN_CHOICE2:
    goto switchD_00498b9e_caseD_3a;
  case SEQ_REP_LEN_MID0:
    goto switchD_00498b9e_caseD_3b;
  case SEQ_REP_LEN_MID1:
    goto switchD_00498b9e_caseD_3c;
  case SEQ_REP_LEN_MID2:
    goto switchD_00498b9e_caseD_3d;
  case SEQ_REP_LEN_HIGH0:
    goto switchD_00498b9e_caseD_3e;
  case SEQ_REP_LEN_HIGH1:
    goto switchD_00498b9e_caseD_3f;
  case SEQ_REP_LEN_HIGH2:
    goto switchD_00498b9e_caseD_40;
  case SEQ_REP_LEN_HIGH3:
    goto switchD_00498b9e_caseD_41;
  case SEQ_REP_LEN_HIGH4:
    goto switchD_00498b9e_caseD_42;
  case SEQ_REP_LEN_HIGH5:
    goto switchD_00498b9e_caseD_43;
  case SEQ_REP_LEN_HIGH6:
    goto switchD_00498b9e_caseD_44;
  case SEQ_REP_LEN_HIGH7:
    goto switchD_00498b9e_caseD_45;
  case SEQ_COPY:
    goto switchD_00498b9e_caseD_46;
  default:
switchD_00498b9e_default:
    sVar28 = sVar17;
    if (uVar32 < 0x1000000) {
      if (sVar31 == in_size) {
        coder->sequence = SEQ_INDICATOR;
        sVar31 = in_size;
        break;
      }
      uVar32 = uVar32 << 8;
      pbVar1 = in + sVar31;
      sVar31 = sVar31 + 1;
      uVar15 = (uint)*pbVar1 | uVar15 << 8;
    }
    coder->sequence = SEQ_BLOCK_HEADER;
  }
LAB_0049bb12:
  uVar24 = (uint)local_a8;
  bVar13 = false;
  bVar12 = true;
  uVar18 = (uint)uVar21;
  local_f4 = LZMA_OK;
  sVar27 = sVar28;
LAB_0049bb1a:
  dictptr->pos = sVar27;
  dictptr->full = local_b0;
  *in_pos = sVar31;
  (coder->rc).range = uVar32;
  (coder->rc).code = uVar15;
  (coder->rc).init_bytes_left = 0;
  coder->state = local_d4;
  coder->rep0 = uVar18;
  coder->rep1 = local_c4;
  coder->rep2 = local_b4;
  coder->rep3 = local_9c;
  coder->probs = *papVar30;
  coder->symbol = uVar35;
  coder->limit = uVar29;
  coder->offset = uVar16;
  coder->len = uVar24;
  if ((coder->uncompressed_size == 0xffffffffffffffff) ||
     (lVar23 = coder->uncompressed_size + (sVar7 - sVar27), coder->uncompressed_size = lVar23,
     !bVar12 || lVar23 != 0)) {
    if (!bVar13) {
      return local_f4;
    }
  }
  else {
    if (coder->sequence == SEQ_INDICATOR) {
      return LZMA_OK;
    }
    if (coder->sequence != SEQ_BLOCK_HEADER) {
      return LZMA_DATA_ERROR;
    }
  }
  (coder->rc).range = 0xffffffff;
  (coder->rc).code = 0;
  (coder->rc).init_bytes_left = 5;
  return (uint)(uVar15 != 0) * 8 + LZMA_STREAM_END;
LAB_0049bc8f:
  coder->sequence = SEQ_COPY;
  bVar13 = false;
  bVar12 = true;
  local_f4 = LZMA_OK;
  goto LAB_0049bb1a;
}

Assistant:

static lzma_ret
lzma_decode(lzma_coder *LZMA_RESTRICT coder, lzma_dict *LZMA_RESTRICT dictptr,
		const uint8_t *LZMA_RESTRICT in,
		size_t *LZMA_RESTRICT in_pos, size_t in_size)
{
	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	////////////////////
	// Initialization //
	////////////////////

	if (!rc_read_init(&coder->rc, in, in_pos, in_size))
		return LZMA_OK;

	rc = coder->rc;
	rc_in_pos = *in_pos;

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};

			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL0);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL1);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL2);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL3);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL4);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL5);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL6);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL7);
#endif
			} else {
#ifndef HAVE_SMALL
				uint32_t match_bit;
				uint32_t subcoder_index;
#endif

				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = dict_get(&dict, rep0) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->pos_slot[get_len_to_pos_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_POS_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_POS_SLOT);
			} while (symbol < POS_SLOTS);
#else
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT0);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT1);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT2);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT3);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT4);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= POS_SLOTS;
			assert(symbol <= 63);

			if (symbol < START_POS_MODEL_INDEX) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < END_POS_MODEL_INDEX) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_POS_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], 0,
							rep0 += 1,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1 << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_POS_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], 0,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					uint32_t distance;

					rc_update_0(coder->is_rep1[state]);

					distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						uint32_t distance;

						rc_update_0(coder->is_rep2[
								state]);

						distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						uint32_t distance;

						rc_update_1(coder->is_rep2[
								state]);

						distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}